

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

void __thiscall
QPDF::validateStreamLineEnd(QPDF *this,QPDFObjectHandle *object,QPDFObjGen og,qpdf_offset_t offset)

{
  bool bVar1;
  int iVar2;
  pointer pMVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  allocator<char> local_231;
  string local_230;
  QPDFExc local_210;
  allocator<char> local_189;
  string local_188;
  QPDFExc local_168;
  allocator<char> local_d1;
  string local_d0;
  QPDFExc local_b0;
  char local_29;
  qpdf_offset_t qStack_28;
  char ch;
  qpdf_offset_t offset_local;
  QPDFObjectHandle *object_local;
  QPDF *this_local;
  QPDFObjGen og_local;
  
  qStack_28 = offset;
  offset_local = (qpdf_offset_t)object;
  object_local = (QPDFObjectHandle *)this;
  this_local = (QPDF *)og;
  while( true ) {
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar3->file);
    iVar2 = (*peVar4->_vptr_InputSource[7])(peVar4,&local_29,1);
    if (CONCAT44(extraout_var,iVar2) == 0) {
      return;
    }
    if (local_29 == '\n') {
      QTC::TC("qpdf","QPDF stream with NL only",0);
      return;
    }
    if (local_29 == '\r') break;
    bVar1 = ::qpdf::util::is_space(local_29);
    if (!bVar1) {
      QTC::TC("qpdf","QPDF stream without newline",0);
      pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pMVar3->file);
      (*peVar4->_vptr_InputSource[8])(peVar4,(ulong)(uint)(int)local_29);
      pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pMVar3->file);
      iVar2 = (*peVar4->_vptr_InputSource[4])();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,"stream keyword not followed by proper line terminator",
                 &local_189);
      damagedPDF(&local_168,this,CONCAT44(extraout_var_02,iVar2),&local_188);
      warn(this,&local_168);
      QPDFExc::~QPDFExc(&local_168);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator(&local_189);
      return;
    }
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar3->file);
    iVar2 = (*peVar4->_vptr_InputSource[4])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"stream keyword followed by extraneous whitespace",&local_231);
    damagedPDF(&local_210,this,CONCAT44(extraout_var_03,iVar2),&local_230);
    warn(this,&local_210);
    QPDFExc::~QPDFExc(&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator(&local_231);
  }
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar3->file);
  iVar2 = (*peVar4->_vptr_InputSource[7])(peVar4,&local_29,1);
  if (CONCAT44(extraout_var_00,iVar2) == 0) {
    return;
  }
  if (local_29 == '\n') {
    QTC::TC("qpdf","QPDF stream with CRNL",0);
    return;
  }
  QTC::TC("qpdf","QPDF stream with CR only",0);
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar3->file);
  (*peVar4->_vptr_InputSource[8])(peVar4,(ulong)(uint)(int)local_29);
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar3->file);
  iVar2 = (*peVar4->_vptr_InputSource[4])();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"stream keyword followed by carriage return only",&local_d1);
  damagedPDF(&local_b0,this,CONCAT44(extraout_var_01,iVar2),&local_d0);
  warn(this,&local_b0);
  QPDFExc::~QPDFExc(&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  return;
}

Assistant:

void
QPDF::validateStreamLineEnd(QPDFObjectHandle& object, QPDFObjGen og, qpdf_offset_t offset)
{
    // The PDF specification states that the word "stream" should be followed by either a carriage
    // return and a newline or by a newline alone.  It specifically disallowed following it by a
    // carriage return alone since, in that case, there would be no way to tell whether the NL in a
    // CR NL sequence was part of the stream data.  However, some readers, including Adobe reader,
    // accept a carriage return by itself when followed by a non-newline character, so that's what
    // we do here. We have also seen files that have extraneous whitespace between the stream
    // keyword and the newline.
    while (true) {
        char ch;
        if (m->file->read(&ch, 1) == 0) {
            // A premature EOF here will result in some other problem that will get reported at
            // another time.
            return;
        }
        if (ch == '\n') {
            // ready to read stream data
            QTC::TC("qpdf", "QPDF stream with NL only");
            return;
        }
        if (ch == '\r') {
            // Read another character
            if (m->file->read(&ch, 1) != 0) {
                if (ch == '\n') {
                    // Ready to read stream data
                    QTC::TC("qpdf", "QPDF stream with CRNL");
                } else {
                    // Treat the \r by itself as the whitespace after endstream and start reading
                    // stream data in spite of not having seen a newline.
                    QTC::TC("qpdf", "QPDF stream with CR only");
                    m->file->unreadCh(ch);
                    warn(damagedPDF(
                        m->file->tell(), "stream keyword followed by carriage return only"));
                }
            }
            return;
        }
        if (!util::is_space(ch)) {
            QTC::TC("qpdf", "QPDF stream without newline");
            m->file->unreadCh(ch);
            warn(damagedPDF(
                m->file->tell(), "stream keyword not followed by proper line terminator"));
            return;
        }
        warn(damagedPDF(m->file->tell(), "stream keyword followed by extraneous whitespace"));
    }
}